

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void avgFinalize(sqlite3_context *context)

{
  Mem *p;
  double *pdVar1;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  pdVar1 = (double *)p->z;
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[2])) {
    sqlite3VdbeMemSetDouble(&context->s,*pdVar1 / (double)(long)pdVar1[2]);
    return;
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    sqlite3_result_double(context, p->rSum/(double)p->cnt);
  }
}